

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O1

void helper_gvec_dup32_arm(void *d,uint32_t desc,uint32_t c)

{
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  
  if (c == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)((desc & 0x1f) * 8 + 8);
    uVar1 = 0;
    do {
      *(uint32_t *)((long)d + uVar1) = c;
      uVar1 = uVar1 + 4;
    } while (uVar1 < uVar2);
  }
  uVar3 = (desc >> 2 & 0xf8) + 8;
  if ((uint)uVar2 < uVar3) {
    uVar1 = (ulong)uVar3;
    if ((ulong)uVar3 < uVar2 + 8) {
      uVar1 = uVar2 + 8;
    }
    memset((void *)((long)d + uVar2),0,(~uVar2 + uVar1 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_dup32)(void *d, uint32_t desc, uint32_t c)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    if (c == 0) {
        oprsz = 0;
    } else {
        for (i = 0; i < oprsz; i += sizeof(uint32_t)) {
            *(uint32_t *)((char *)d + i) = c;
        }
    }
    clear_high(d, oprsz, desc);
}